

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveTessellation.h
# Opt level: O2

pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
* __thiscall
anurbs::CurveTessellation<3L>::compute
          (pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
           *__return_storage_ptr__,CurveTessellation<3L> *this,CurveBaseD *curve,double tolerance)

{
  long lVar1;
  pointer pdVar2;
  long lVar3;
  Index i;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double in_XMM1_Qa;
  double dVar9;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  sample_points;
  vector<double,_std::allocator<double>_> parameters;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  points;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  locations;
  double local_d8;
  double t;
  Vector point_1;
  pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> local_50;
  
  dVar5 = (double)(**(code **)(*(long *)this + 0x18))(this);
  sample_points.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sample_points.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sample_points.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  points.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  points.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  points.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)this + 0x20))(&parameters,this);
  in_XMM1_Qa = in_XMM1_Qa - dVar5;
  for (pdVar2 = parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 2) {
    auVar7._0_8_ = *pdVar2 - dVar5;
    auVar7._8_8_ = pdVar2[1] - dVar5;
    auVar8._8_8_ = ABS(in_XMM1_Qa);
    auVar8._0_8_ = ABS(in_XMM1_Qa);
    auVar8 = divpd(auVar7,auVar8);
    if (1e-07 <= ABS(auVar8._8_8_ - auVar8._0_8_)) {
      t = auVar8._0_8_;
      (**(code **)(*(long *)this + 0x28))(*pdVar2,(Matrix<double,_1,_3,_1,_1,_3> *)&locations,this);
      std::
      vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
      ::emplace_back<double_const&,Eigen::Matrix<double,1,3,1,1,3>const&>
                ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
                  *)&sample_points,&t,(Matrix<double,_1,_3,_1,_1,_3> *)&locations);
    }
  }
  std::_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~_Vector_base
            ((_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&parameters);
  locations.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  (**(code **)(*(long *)this + 0x28))(dVar5 + in_XMM1_Qa,&parameters,this);
  std::
  vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
  ::emplace_back<double,Eigen::Matrix<double,1,3,1,1,3>>
            ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
              *)&sample_points,(double *)&locations,(Matrix<double,_1,_3,_1,_1,_3> *)&parameters);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<anurbs::CurveTessellation<3l>::compute(anurbs::CurveBase<3l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (sample_points.
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             sample_points.
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  lVar1 = (**(code **)(*(long *)this + 0x10))(this);
  lVar4 = lVar1 * 2 + 1;
  lVar3 = 0;
  if (0 < lVar4) {
    lVar3 = lVar4;
  }
  while( true ) {
    parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)sample_points.
                        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].first;
    parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)sample_points.
                         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                         m_data.array[0];
    parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)sample_points.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                  array[1];
    locations.
    super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((double)parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start * in_XMM1_Qa + dVar5);
    sample_points.
    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         sample_points.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::
    vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
    ::emplace_back<double,Eigen::Matrix<double,1,3,1,1,3>const&>
              ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
                *)&points,(double *)&locations,
               (Matrix<double,_1,_3,_1,_1,_3> *)
               &parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish);
    if (sample_points.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        sample_points.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    while( true ) {
      locations.
      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)sample_points.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].first;
      locations.
      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)sample_points.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                    super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                    array[0];
      locations.
      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)sample_points.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                    super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                    array[1];
      t = 0.0;
      local_d8 = 0.0;
      for (lVar4 = 1; lVar4 - lVar3 != 1; lVar4 = lVar4 + 1) {
        dVar9 = ((double)locations.
                         super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                (double)parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start) *
                ((double)lVar4 / (double)(lVar1 * 2 + 2)) +
                (double)parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
        (**(code **)(*(long *)this + 0x28))(in_XMM1_Qa * dVar9 + dVar5,&point_1,this);
        dVar6 = distance_to_line(&point_1,(Vector *)
                                          &parameters.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish,
                                 (Vector *)
                                 &locations.
                                  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        if (local_d8 < dVar6) {
          local_50.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
          m_data.array[2] =
               point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
               .array[2];
          local_50.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
          m_data.array[0] =
               point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
               .array[0];
          local_50.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
          m_data.array[1] =
               point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
               .array[1];
          local_50.first = dVar9;
          std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::operator=
                    ((pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&t,&local_50);
          local_d8 = dVar6;
        }
      }
      if (local_d8 < tolerance) break;
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ::push_back(&sample_points,(value_type *)&t);
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&parameters,
             (long)points.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)points.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&locations);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector(&locations,
           (long)points.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)points.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&t);
  lVar4 = 8;
  lVar3 = 0;
  for (lVar1 = 0;
      lVar1 < (long)points.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)points.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5; lVar1 = lVar1 + 1) {
    parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar1] =
         *(double *)
          ((long)((points.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
          + lVar4 + -0x10);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
              ((Matrix<double,_1,_3,_1,_1,_3> *)
               ((long)((locations.
                        super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
                      .array + lVar3),
               (Matrix<double,_1,_3,_1,_1,_3> *)
               ((long)((points.
                        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second).
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                      array + lVar4 + -8));
    lVar3 = lVar3 + 0x18;
    lVar4 = lVar4 + 0x20;
  }
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::
  pair<std::vector<double,_std::allocator<double>_>_&,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_&,_true>
            (__return_storage_ptr__,&parameters,&locations);
  std::
  _Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::~_Vector_base(&locations.
                   super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 );
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&parameters.super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::~_Vector_base(&points.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 );
  std::
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::~_Vector_base(&sample_points.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::vector<double>, std::vector<Vector>> compute(const CurveBaseD& curve, const double tolerance)
    {
        const Interval domain = curve.domain();

        std::vector<ParameterPoint> sample_points;
        std::vector<ParameterPoint> points;

        // compute sample points

        for (const auto& span : curve.spans()) {
            const Interval normalized_span = domain.normalized_interval(span);

            if (normalized_span.length() < 1e-7) {
                continue;
            }

            const double t = normalized_span.t0();
            const Vector point = curve.point_at(span.t0());

            sample_points.emplace_back(t, point);
        }

        sample_points.emplace_back(1.0, curve.point_at(domain.parameter_at_normalized(1.0)));

        std::sort(std::begin(sample_points), std::end(sample_points),
            [](auto const& lhs, auto const& rhs) {
                return std::get<0>(lhs) > std::get<0>(rhs);
            });

        // compute polyline

        const Index n = curve.degree() * 2 + 1;

        while (true) {
            const auto [t_a, point_a] = sample_points.back();
            sample_points.pop_back();

            points.emplace_back(domain.parameter_at_normalized(t_a), point_a);

            if (sample_points.empty()) {
                break;
            }

            while (true) {
                const auto [t_b, point_b] = sample_points.back();

                double max_distance {0};
                ParameterPoint max_point;

                for (Index i = 1; i <= n; i++) {
                    const double t = Interval::parameter_at_normalized(t_a, t_b, i / double(n + 1));
                    const Vector point = curve.point_at(domain.parameter_at_normalized(t));

                    const double distance = distance_to_line(point, point_a, point_b);

                    if (distance > max_distance) {
                        max_distance = distance;
                        max_point = {t, point};
                    }
                }

                if (max_distance < tolerance) {
                    break;
                }

                sample_points.push_back(max_point);
            }
        }

        std::vector<double> parameters(points.size());
        std::vector<Vector> locations(points.size());

        for (Index i = 0; i < length(points); i++) {
            parameters[i] = std::get<0>(points[i]);
            locations[i] = std::get<1>(points[i]);
        }

        return {parameters, locations};
    }